

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O2

BoxList * __thiscall amrex::BoxList::intersect(BoxList *this,BoxList *bl)

{
  BoxList local_a0;
  BoxArray local_80;
  
  BoxArray::BoxArray(&local_80,this);
  amrex::intersect(&local_a0,&local_80,bl);
  operator=(this,&local_a0);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&local_a0);
  BoxArray::~BoxArray(&local_80);
  return this;
}

Assistant:

BoxList&
BoxList::intersect (const BoxList& bl)
{
    BL_ASSERT(ixType() == bl.ixType());
    *this = amrex::intersect(BoxArray{*this}, bl);
    return *this;
}